

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void __thiscall re2c::Skeleton::emit_data(Skeleton *this,char *fname)

{
  FILE *__stream;
  FILE *__stream_00;
  allocator<char> local_b9;
  string keys_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string input_name;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,fname,(allocator<char> *)&local_58);
  std::operator+(&local_78,&local_98,".");
  std::operator+(&keys_name,&local_78,&this->name);
  std::operator+(&input_name,&keys_name,".input");
  std::__cxx11::string::~string((string *)&keys_name);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  __stream = fopen(input_name._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    error("cannot open file: %s",input_name._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,fname,&local_b9);
    std::operator+(&local_98,&local_58,".");
    std::operator+(&local_78,&local_98,&this->name);
    std::operator+(&keys_name,&local_78,".keys");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    __stream_00 = fopen(keys_name._M_dataplus._M_p,"wb");
    if (__stream_00 != (FILE *)0x0) {
      generate_paths(this,(FILE *)__stream,(FILE *)__stream_00);
      fclose(__stream);
      fclose(__stream_00);
      std::__cxx11::string::~string((string *)&keys_name);
      std::__cxx11::string::~string((string *)&input_name);
      return;
    }
    error("cannot open file: %s",keys_name._M_dataplus._M_p);
  }
  exit(1);
}

Assistant:

void Skeleton::emit_data (const char * fname)
{
	const std::string input_name = std::string (fname) + "." + name + ".input";
	FILE * input = fopen (input_name.c_str (), "wb");
	if (!input)
	{
		error ("cannot open file: %s", input_name.c_str ());
		exit (1);
	}
	const std::string keys_name = std::string (fname) + "." + name + ".keys";
	FILE * keys = fopen (keys_name.c_str (), "wb");
	if (!keys)
	{
		error ("cannot open file: %s", keys_name.c_str ());
		exit (1);
	}

	generate_paths (input, keys);

	fclose (input);
	fclose (keys);
}